

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O1

int run_test_process_title_threadsafe(void)

{
  uv_loop_t **buffer;
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  int extraout_EDX;
  code *unaff_RBX;
  size_t unaff_RBP;
  void **ppvVar4;
  uv_sem_t *sem;
  long *title;
  uv_handle_t *puVar5;
  long lVar6;
  int64_t eval_b_2;
  int64_t eval_b_3;
  uv_thread_t getter_thread;
  uv_thread_t setter_threads [4];
  uv_sem_t getter_sem;
  uv_handle_t auStack_f68 [4];
  uv_loop_t *puStack_e60;
  undefined8 uStack_e50;
  code *pcStack_e48;
  void *pvStack_e40;
  undefined1 auStack_e38 [16];
  uv_process_t uStack_e28;
  uv_loop_t *puStack_dc0;
  char *pcStack_db8;
  long *plStack_db0;
  long *plStack_da8;
  undefined8 uStack_da0;
  uv_process_options_t uStack_d90;
  long alStack_d40 [63];
  undefined1 uStack_b41;
  uv_loop_t uStack_b40;
  char *pcStack_740;
  char *pcStack_738;
  code *pcStack_730;
  undefined8 uStack_728;
  long lStack_720;
  char acStack_718 [512];
  code *pcStack_518;
  long alStack_510 [66];
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  long lStack_2f0;
  uv_sem_t *puStack_2e8;
  char *pcStack_2e0;
  char *pcStack_2d8;
  char *pcStack_2d0;
  code *pcStack_2c8;
  undefined8 uStack_2c0;
  size_t sStack_2b8;
  char acStack_2b0 [520];
  code *pcStack_a8;
  undefined1 local_70 [24];
  uv_thread_t local_58 [5];
  uv_sem_t local_30;
  
  iVar1 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  local_58[0] = (uv_thread_t)iVar1;
  local_30.__align = 0;
  if (local_58[0] != 0) goto LAB_001b35d6;
  iVar1 = uv_sem_init(&local_30,0);
  local_58[0] = (uv_thread_t)iVar1;
  local_70._16_8_ = 0;
  if (local_58[0] != 0) goto LAB_001b35e5;
  iVar1 = uv_thread_create((uv_thread_t *)(local_70 + 0x10),getter_thread_body,&local_30);
  local_58[0] = (uv_thread_t)iVar1;
  local_70._0_8_ = 0;
  if (local_58[0] == 0) {
    lVar6 = 0;
    unaff_RBX = setter_thread_body;
    do {
      local_70._0_8_ = 0;
      iVar1 = uv_thread_create((uv_thread_t *)(local_70 + lVar6 + 0x18),setter_thread_body,
                               (void *)0x0);
      local_70._0_8_ = SEXT48(iVar1);
      local_70._8_8_ = 0;
      if (local_70._0_8_ != 0) {
        run_test_process_title_threadsafe_cold_4();
        goto LAB_001b35c7;
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x20);
    unaff_RBX = (code *)0x0;
    do {
      local_70._0_8_ = 0;
      local_70._8_8_ = 0;
      iVar1 = uv_thread_join((uv_thread_t *)(unaff_RBX + (long)(local_70 + 0x18)));
      local_70._0_8_ = SEXT48(iVar1);
      local_70._8_8_ = 0;
      if (local_70._0_8_ != 0) goto LAB_001b35c7;
      unaff_RBX = unaff_RBX + 8;
    } while (unaff_RBX != (code *)0x20);
    uv_sem_post(&local_30);
    iVar1 = uv_thread_join((uv_thread_t *)(local_70 + 0x10));
    local_70._0_8_ = SEXT48(iVar1);
    local_70._8_8_ = 0;
    if (local_70._0_8_ == 0) {
      uv_sem_destroy(&local_30);
      return 0;
    }
    goto LAB_001b3603;
  }
  goto LAB_001b35f4;
LAB_001b375e:
  uStack_300 = 0x1b3766;
  iVar2 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  lStack_2f0 = (long)iVar2;
  uStack_2f8 = 0;
  if (lStack_2f0 != 0) {
LAB_001b3826:
    uStack_300 = 0x1b3833;
    setter_thread_body_cold_1();
    title = alStack_510;
    pcStack_518 = (code *)0x1b3847;
    set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
    pcStack_518 = (code *)0x1b3853;
    set_title("new title");
    pcStack_518 = (code *)0x1b385f;
    iVar1 = uv_get_process_title((char *)0x0,100);
    alStack_510[2] = (long)iVar1;
    alStack_510[0] = -0x16;
    if (alStack_510[2] == -0x16) {
      pcStack_518 = (code *)0x1b3885;
      iVar1 = uv_get_process_title((char *)(alStack_510 + 2),0);
      alStack_510[0] = (long)iVar1;
      alStack_510[1] = 0xffffffffffffffea;
      if (alStack_510[0] != -0x16) goto LAB_001b38df;
      pcStack_518 = (code *)0x1b38ae;
      iVar1 = uv_get_process_title((char *)(alStack_510 + 2),1);
      alStack_510[0] = (long)iVar1;
      alStack_510[1] = 0xffffffffffffff97;
      if (alStack_510[0] == -0x69) {
        return 0;
      }
    }
    else {
      pcStack_518 = (code *)0x1b38df;
      run_test_process_title_cold_1();
LAB_001b38df:
      pcStack_518 = (code *)0x1b38ec;
      run_test_process_title_cold_2();
    }
    pcStack_518 = set_title;
    run_test_process_title_cold_3();
    pcStack_518 = (code *)0x2044ca;
    pcStack_730 = (code *)0x1b3913;
    iVar1 = uv_get_process_title(acStack_718,0x200);
    lStack_720 = (long)iVar1;
    uStack_728 = 0;
    if (lStack_720 == 0) {
      pcStack_730 = (code *)0x1b3935;
      iVar1 = uv_set_process_title((char *)title);
      lStack_720 = (long)iVar1;
      uStack_728 = 0;
      if (lStack_720 != 0) goto LAB_001b39b5;
      pcStack_730 = (code *)0x1b395e;
      iVar1 = uv_get_process_title(acStack_718,0x200);
      lStack_720 = (long)iVar1;
      uStack_728 = 0;
      if (lStack_720 != 0) goto LAB_001b39c2;
      pcStack_730 = (code *)0x1b3985;
      iVar1 = strcmp(acStack_718,(char *)title);
      lStack_720 = (long)iVar1;
      uStack_728 = 0;
      if (lStack_720 == 0) {
        return iVar1;
      }
    }
    else {
      pcStack_730 = (code *)0x1b39b5;
      set_title_cold_1();
LAB_001b39b5:
      pcStack_730 = (code *)0x1b39c2;
      set_title_cold_2();
LAB_001b39c2:
      pcStack_730 = (code *)0x1b39cf;
      set_title_cold_3();
    }
    pcStack_730 = run_test_process_title_big_argv;
    set_title_cold_4();
    pcStack_730 = (code *)0x204560;
    pcStack_738 = "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82";
    ppvVar4 = &pvStack_e40;
    auStack_e38._8_8_ = (uv_loop_t *)0x3ff;
    loop = &uStack_b40;
    pcStack_e48 = (code *)0x1b3a04;
    pcStack_740 = (char *)title;
    iVar1 = uv_exepath((char *)loop,(size_t *)(auStack_e38 + 8));
    alStack_d40[0] = (long)iVar1;
    uStack_e28.data = (void *)0x0;
    if (alStack_d40[0] == 0) {
      *(undefined1 *)((long)(auStack_e38._8_8_ + 0x38) + (long)(uStack_b40.reserved + -0xe)) = 0;
      pcStack_e48 = (code *)0x1b3a54;
      memset(alStack_d40,0x78,0x1ff);
      uStack_b41 = 0;
      uStack_d90.args = (char **)&puStack_dc0;
      pcStack_db8 = "process_title_big_argv_helper";
      uStack_da0 = 0;
      uStack_d90.env = (char **)0x0;
      uStack_d90.cwd = (char *)0x0;
      uStack_d90.flags = 0;
      uStack_d90.stdio_count = 0;
      uStack_d90.stdio = (uv_stdio_container_t *)0x0;
      uStack_d90.uid = 0;
      uStack_d90.gid = 0;
      uStack_d90.cpumask = (char *)0x0;
      uStack_d90.cpumask_size = 0;
      uStack_d90.exit_cb = exit_cb;
      pcStack_e48 = (code *)0x1b3ab7;
      puStack_dc0 = loop;
      plStack_db0 = alStack_d40;
      plStack_da8 = alStack_d40;
      uStack_d90.file = (char *)loop;
      puVar3 = uv_default_loop();
      pcStack_e48 = (code *)0x1b3ac7;
      iVar1 = uv_spawn(puVar3,&uStack_e28,&uStack_d90);
      auStack_e38._0_8_ = SEXT48(iVar1);
      pvStack_e40 = (void *)0x0;
      if ((void *)auStack_e38._0_8_ != (void *)0x0) goto LAB_001b3b7a;
      pcStack_e48 = (code *)0x1b3ae6;
      puVar3 = uv_default_loop();
      pcStack_e48 = (code *)0x1b3af0;
      iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_e38._0_8_ = SEXT48(iVar1);
      pvStack_e40 = (void *)0x0;
      if ((void *)auStack_e38._0_8_ == (void *)0x0) {
        pcStack_e48 = (code *)0x1b3b0f;
        loop = uv_default_loop();
        pcStack_e48 = (code *)0x1b3b23;
        uv_walk(loop,close_walk_cb,(void *)0x0);
        pcStack_e48 = (code *)0x1b3b2d;
        uv_run(loop,UV_RUN_DEFAULT);
        auStack_e38._0_8_ = (void *)0x0;
        pcStack_e48 = (code *)0x1b3b3b;
        puVar3 = uv_default_loop();
        pcStack_e48 = (code *)0x1b3b43;
        iVar1 = uv_loop_close(puVar3);
        pvStack_e40 = (void *)(long)iVar1;
        if ((void *)auStack_e38._0_8_ == pvStack_e40) {
          pcStack_e48 = (code *)0x1b3b59;
          uv_library_shutdown();
          return 0;
        }
        goto LAB_001b3b94;
      }
    }
    else {
      pcStack_e48 = (code *)0x1b3b7a;
      run_test_process_title_big_argv_cold_1();
LAB_001b3b7a:
      pcStack_e48 = (code *)0x1b3b87;
      run_test_process_title_big_argv_cold_2();
    }
    pcStack_e48 = (code *)0x1b3b94;
    run_test_process_title_big_argv_cold_3();
LAB_001b3b94:
    puVar5 = (uv_handle_t *)auStack_e38;
    pcStack_e48 = exit_cb;
    run_test_process_title_big_argv_cold_4();
    uStack_e50 = 0;
    if (ppvVar4 == (void **)0x0) {
      pcStack_e48 = (code *)(long)extraout_EDX;
      uStack_e50 = 0;
      if (pcStack_e48 == (code *)0x0) {
        uv_close(puVar5,(uv_close_cb)0x0);
        return extraout_EAX;
      }
    }
    else {
      puStack_e60 = (uv_loop_t *)0x1b3bf6;
      pcStack_e48 = (code *)ppvVar4;
      exit_cb_cold_1();
    }
    puStack_e60 = (uv_loop_t *)process_title_big_argv;
    exit_cb_cold_2();
    buffer = &auStack_f68[0].loop;
    puStack_e60 = loop;
    memset(buffer,0,0x100);
    auStack_f68[0].loop._0_4_ = 0x6c696166;
    uv_get_process_title((char *)buffer,0x100);
    auStack_f68[0].data = (void *)0x0;
    iVar1 = strcmp((char *)buffer,"fail");
    if (auStack_f68[0].data != (void *)(long)iVar1) {
      return (int)auStack_f68[0].data;
    }
    puVar5 = auStack_f68;
    process_title_big_argv_cold_1();
    iVar1 = uv_is_closing(puVar5);
    if (iVar1 != 0) {
      return iVar1;
    }
    uv_close(puVar5,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  uStack_300 = 0x1b378c;
  iVar2 = uv_set_process_title
                    ("jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82");
  lStack_2f0 = (long)iVar2;
  uStack_2f8 = 0;
  if (lStack_2f0 != 0) {
LAB_001b3819:
    uStack_300 = 0x1b3826;
    setter_thread_body_cold_2();
    goto LAB_001b3826;
  }
  uStack_300 = 0x1b37ae;
  iVar2 = uv_set_process_title
                    ("9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT");
  lStack_2f0 = (long)iVar2;
  uStack_2f8 = 0;
  if (lStack_2f0 != 0) {
LAB_001b380c:
    uStack_300 = 0x1b3819;
    setter_thread_body_cold_3();
    goto LAB_001b3819;
  }
  uStack_300 = 0x1b37d0;
  iVar2 = uv_set_process_title
                    ("n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU");
  lStack_2f0 = (long)iVar2;
  uStack_2f8 = 0;
  if (lStack_2f0 != 0) {
    uStack_300 = 0x1b380c;
    setter_thread_body_cold_4();
    goto LAB_001b380c;
  }
  iVar1 = iVar1 + -1;
  lStack_2f0 = 0;
  if (iVar1 == 0) {
    return iVar2;
  }
  goto LAB_001b375e;
LAB_001b35c7:
  run_test_process_title_threadsafe_cold_5();
LAB_001b35d6:
  run_test_process_title_threadsafe_cold_1();
LAB_001b35e5:
  run_test_process_title_threadsafe_cold_2();
LAB_001b35f4:
  run_test_process_title_threadsafe_cold_3();
LAB_001b3603:
  sem = (uv_sem_t *)local_70;
  run_test_process_title_threadsafe_cold_6();
  pcStack_2c8 = (code *)0x1b362b;
  pcStack_a8 = unaff_RBX;
  iVar1 = uv_sem_trywait(sem);
  if (iVar1 == -0xb) {
    do {
      pcStack_2c8 = (code *)0x1b365b;
      iVar1 = uv_get_process_title(acStack_2b0,0x200);
      sStack_2b8 = (size_t)iVar1;
      uStack_2c0 = 0;
      if (sStack_2b8 != 0) {
LAB_001b371f:
        pcStack_2c8 = (code *)0x1b372c;
        getter_thread_body_cold_1();
LAB_001b372c:
        pcStack_2c8 = setter_thread_body;
        getter_thread_body_cold_3();
        pcStack_2d0 = "8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled";
        pcStack_2e0 = "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82";
        iVar1 = 0x32;
        puStack_2e8 = sem;
        pcStack_2d8 = acStack_2b0;
        pcStack_2c8 = (code *)unaff_RBP;
        goto LAB_001b375e;
      }
      pcStack_2c8 = (code *)0x1b3681;
      unaff_RBP = strlen(acStack_2b0);
      uStack_2c0 = 0;
      sStack_2b8 = unaff_RBP;
      if ((long)unaff_RBP < 1) {
        pcStack_2c8 = (code *)0x1b371f;
        getter_thread_body_cold_2();
        goto LAB_001b371f;
      }
      pcStack_2c8 = (code *)0x1b36aa;
      iVar1 = strncmp(acStack_2b0,
                      "8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled",
                      unaff_RBP);
      if (iVar1 != 0) {
        pcStack_2c8 = (code *)0x1b36bc;
        iVar1 = strncmp(acStack_2b0,
                        "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82"
                        ,unaff_RBP);
        if (iVar1 == 0) goto LAB_001b36e8;
        pcStack_2c8 = (code *)0x1b36ce;
        iVar1 = strncmp(acStack_2b0,
                        "9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT"
                        ,unaff_RBP);
        if (iVar1 == 0) goto LAB_001b36e8;
        pcStack_2c8 = (code *)0x1b36e4;
        iVar1 = strncmp(acStack_2b0,
                        "n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU"
                        ,unaff_RBP);
        if (iVar1 == 0) goto LAB_001b36e8;
        goto LAB_001b372c;
      }
LAB_001b36e8:
      pcStack_2c8 = (code *)0x1b36ef;
      uv_sleep(0);
      pcStack_2c8 = (code *)0x1b36f7;
      iVar1 = uv_sem_trywait(sem);
    } while (iVar1 == -0xb);
  }
  return iVar1;
}

Assistant:

TEST_IMPL(process_title_threadsafe) {
  uv_thread_t setter_threads[4];
  uv_thread_t getter_thread;
  uv_sem_t getter_sem;
  int i;

#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__MVS__) || defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  ASSERT_OK(uv_set_process_title(titles[0]));

  ASSERT_OK(uv_sem_init(&getter_sem, 0));
  ASSERT_OK(uv_thread_create(&getter_thread, getter_thread_body, &getter_sem));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT_OK(uv_thread_create(&setter_threads[i], setter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT_OK(uv_thread_join(&setter_threads[i]));

  uv_sem_post(&getter_sem);
  ASSERT_OK(uv_thread_join(&getter_thread));
  uv_sem_destroy(&getter_sem);

  return 0;
}